

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>
::val(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>
      *this)

{
  FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
  *pFVar1;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar2;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar3;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar4;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
  *pFVar5;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar6;
  
  pFVar1 = (this->left_->fadexpr_).left_;
  pFVar2 = (this->left_->fadexpr_).right_;
  pFVar3 = (pFVar1->fadexpr_).left_;
  pFVar4 = (pFVar1->fadexpr_).right_;
  pFVar5 = (this->right_->fadexpr_).left_;
  pFVar6 = (pFVar5->fadexpr_).left_;
  return ((((pFVar6->fadexpr_).left_.constant_ + ((pFVar6->fadexpr_).right_)->val_) -
          ((pFVar5->fadexpr_).right_)->val_) + ((this->right_->fadexpr_).right_)->val_) *
         ((pFVar2->fadexpr_).left_.constant_ + ((pFVar2->fadexpr_).right_)->val_) *
         ((pFVar4->fadexpr_).left_.constant_ + ((pFVar4->fadexpr_).right_)->val_) *
         ((pFVar3->fadexpr_).left_.constant_ + ((pFVar3->fadexpr_).right_)->val_);
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}